

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
::
nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>&&,slang::ast::ConfigBlockSymbol::CellOverride&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<std::basic_string_view<char,_std::char_traits<char>_>_&&,_slang::ast::ConfigBlockSymbol::CellOverride_&&>
          *args)

{
  group_type_pointer pgVar1;
  value_type_pointer ppVar2;
  group_type_pointer pgVar3;
  CellOverride *pCVar4;
  ulong uVar5;
  uint uVar6;
  ushort uVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  value_type_pointer ppVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  pgVar3 = arrays_->groups_;
  lVar12 = pos0 * 0x10;
  pgVar1 = pgVar3 + pos0;
  auVar15[0] = -(pgVar1->m[0].n == '\0');
  auVar15[1] = -(pgVar1->m[1].n == '\0');
  auVar15[2] = -(pgVar1->m[2].n == '\0');
  auVar15[3] = -(pgVar1->m[3].n == '\0');
  auVar15[4] = -(pgVar1->m[4].n == '\0');
  auVar15[5] = -(pgVar1->m[5].n == '\0');
  auVar15[6] = -(pgVar1->m[6].n == '\0');
  auVar15[7] = -(pgVar1->m[7].n == '\0');
  auVar15[8] = -(pgVar1->m[8].n == '\0');
  auVar15[9] = -(pgVar1->m[9].n == '\0');
  auVar15[10] = -(pgVar1->m[10].n == '\0');
  auVar15[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar15[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar15[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar15[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar15[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar14 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
  if (uVar14 == 0) {
    uVar5 = arrays_->groups_size_mask;
    lVar13 = 1;
    do {
      pgVar3[pos0].m[0xf].n = pgVar3[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar13 & uVar5;
      lVar12 = pos0 * 0x10;
      pgVar1 = pgVar3 + pos0;
      auVar16[0] = -(pgVar1->m[0].n == '\0');
      auVar16[1] = -(pgVar1->m[1].n == '\0');
      auVar16[2] = -(pgVar1->m[2].n == '\0');
      auVar16[3] = -(pgVar1->m[3].n == '\0');
      auVar16[4] = -(pgVar1->m[4].n == '\0');
      auVar16[5] = -(pgVar1->m[5].n == '\0');
      auVar16[6] = -(pgVar1->m[6].n == '\0');
      auVar16[7] = -(pgVar1->m[7].n == '\0');
      auVar16[8] = -(pgVar1->m[8].n == '\0');
      auVar16[9] = -(pgVar1->m[9].n == '\0');
      auVar16[10] = -(pgVar1->m[10].n == '\0');
      auVar16[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar16[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar16[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar16[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar16[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar7 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe;
      uVar14 = (uint)uVar7;
      lVar13 = lVar13 + 1;
    } while (uVar7 == 0);
  }
  uVar6 = 0;
  if (uVar14 != 0) {
    for (; (uVar14 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
    }
  }
  ppVar2 = arrays_->elements_ + pos0 * 0xf + (ulong)uVar6;
  pcVar8 = args->first->_M_str;
  (ppVar2->first)._M_len = args->first->_M_len;
  (ppVar2->first)._M_str = pcVar8;
  pCVar4 = args->second;
  sVar9 = (pCVar4->specificLibRules).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
          .arrays.groups_size_index;
  sVar10 = (pCVar4->specificLibRules).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
           .arrays.groups_size_mask;
  ppVar11 = (pCVar4->specificLibRules).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
            .arrays.elements_;
  (ppVar2->second).specificLibRules.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
  .arrays.groups_ =
       (pCVar4->specificLibRules).table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
       .arrays.groups_;
  (ppVar2->second).specificLibRules.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
  .arrays.elements_ = ppVar11;
  (ppVar2->second).specificLibRules.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
  .arrays.groups_size_index = sVar9;
  (ppVar2->second).specificLibRules.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
  .arrays.groups_size_mask = sVar10;
  sVar9 = (pCVar4->specificLibRules).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
          .size_ctrl.size;
  (ppVar2->second).specificLibRules.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
  .size_ctrl.ml =
       (pCVar4->specificLibRules).table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
       .size_ctrl.ml;
  (ppVar2->second).specificLibRules.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
  .size_ctrl.size = sVar9;
  (pCVar4->specificLibRules).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (pCVar4->specificLibRules).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
  .arrays.groups_size_mask = 1;
  (pCVar4->specificLibRules).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  *(undefined1 (*) [16])
   &(pCVar4->specificLibRules).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
    .arrays.elements_ = (undefined1  [16])0x0;
  (pCVar4->specificLibRules).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
  .size_ctrl.size = 0;
  (ppVar2->second).defaultRule = pCVar4->defaultRule;
  (pgVar3->m + lVar12)[uVar6].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + (hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar3->m + lVar12);
  __return_storage_ptr__->n = uVar6;
  __return_storage_ptr__->p = ppVar2;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }